

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.h
# Opt level: O2

uint __thiscall pktalloc::Allocator::GetMemoryUsedBytes(Allocator *this)

{
  WindowHeader *pWVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = 0;
  for (uVar3 = 0; (this->PreferredWindows).Size != uVar3; uVar3 = uVar3 + 1) {
    pWVar1 = (this->PreferredWindows).DataPtr[(int)uVar3];
    if (pWVar1 != (WindowHeader *)0x0) {
      iVar2 = (iVar2 - pWVar1->FreeUnitCount) + 0x800;
    }
  }
  for (uVar3 = 0; (this->FullWindows).Size != uVar3; uVar3 = uVar3 + 1) {
    pWVar1 = (this->FullWindows).DataPtr[(int)uVar3];
    if (pWVar1 != (WindowHeader *)0x0) {
      iVar2 = (iVar2 - pWVar1->FreeUnitCount) + 0x800;
    }
  }
  return iVar2 << 5;
}

Assistant:

PKTALLOC_FORCE_INLINE unsigned GetSize() const
    {
        return Size;
    }